

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O2

int AF_AActor_A_SpawnProjectile
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  bool bVar5;
  BYTE BVar6;
  AActor *pAVar7;
  AActor *pAVar8;
  AActor *pAVar9;
  long lVar10;
  AActor *origin;
  uint uVar11;
  bool precise;
  char *pcVar12;
  uint uVar13;
  PClassActor *type;
  undefined4 uVar14;
  undefined4 uVar15;
  void *pvVar16;
  double dVar17;
  double dVar18;
  double local_d8;
  double local_d0;
  void *local_b8;
  double local_a0;
  undefined1 local_98 [24];
  double dStack_80;
  double local_78;
  DVector3 local_68;
  DVector3 local_48;
  
  if (numparam < 1) {
    pcVar12 = "(paramnum) < numparam";
    goto LAB_003dbe0f;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_003dbdf3:
    pcVar12 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_003dbe0f:
    __assert_fail(pcVar12,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x5b7,
                  "int AF_AActor_A_SpawnProjectile(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  origin = *(AActor **)&param->field_0;
  if ((param->field_0).field_1.atag == 1) {
    if (origin == (AActor *)0x0) goto LAB_003db7d9;
    bVar5 = DObject::IsKindOf((DObject *)origin,AActor::RegistrationInfo.MyClass);
    if (!bVar5) {
      pcVar12 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_003dbe0f;
    }
  }
  else {
    if (origin != (AActor *)0x0) goto LAB_003dbdf3;
LAB_003db7d9:
    origin = (AActor *)0x0;
  }
  if (numparam == 1) {
    pcVar12 = "(paramnum) < numparam";
    goto LAB_003dbee7;
  }
  if (param[1].field_0.field_3.Type != '\x03') {
LAB_003dbdfc:
    pcVar12 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_003dbee7:
    __assert_fail(pcVar12,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x5b8,
                  "int AF_AActor_A_SpawnProjectile(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  type = (PClassActor *)param[1].field_0.field_1.a;
  if (param[1].field_0.field_1.atag == 1) {
    if (type == (PClassActor *)0x0) goto LAB_003db827;
    bVar5 = PClass::IsAncestorOf(AActor::RegistrationInfo.MyClass,(PClass *)type);
    if (!bVar5) {
      pcVar12 = "ti == NULL || ti->IsDescendantOf(RUNTIME_CLASS(AActor))";
      goto LAB_003dbee7;
    }
    bVar5 = false;
  }
  else {
    if (type != (PClassActor *)0x0) goto LAB_003dbdfc;
LAB_003db827:
    bVar5 = true;
    type = (PClassActor *)0x0;
  }
  if ((uint)numparam < 3) {
    param = defaultparam->Array;
    if (param[2].field_0.field_3.Type != '\x01') {
      pcVar12 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
      goto LAB_003dbec8;
    }
    pvVar16 = param[2].field_0.field_1.a;
LAB_003db868:
    if (param[3].field_0.field_3.Type != '\x01') {
      pcVar12 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
LAB_003dbf06:
      __assert_fail(pcVar12,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x5ba,
                    "int AF_AActor_A_SpawnProjectile(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    local_b8 = param[3].field_0.field_1.a;
LAB_003db879:
    if (param[4].field_0.field_3.Type != '\x01') {
      pcVar12 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
LAB_003dbe97:
      __assert_fail(pcVar12,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x5bb,
                    "int AF_AActor_A_SpawnProjectile(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    uVar14 = (undefined4)*(undefined8 *)&param[4].field_0;
    uVar15 = (undefined4)((ulong)*(undefined8 *)&param[4].field_0 >> 0x20);
LAB_003db88a:
    if (param[5].field_0.field_3.Type != '\0') {
      pcVar12 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003dbe78:
      __assert_fail(pcVar12,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x5bc,
                    "int AF_AActor_A_SpawnProjectile(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    uVar11 = param[5].field_0.i;
LAB_003db899:
    if (param[6].field_0.field_3.Type != '\x01') {
      pcVar12 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
LAB_003dbe59:
      __assert_fail(pcVar12,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x5bd,
                    "int AF_AActor_A_SpawnProjectile(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    local_d8 = param[6].field_0.f;
LAB_003db8b0:
    local_d0 = (double)CONCAT44(uVar15,uVar14);
    if (param[7].field_0.field_3.Type != '\0') {
      pcVar12 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003dbe3a:
      __assert_fail(pcVar12,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x5be,
                    "int AF_AActor_A_SpawnProjectile(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
  }
  else {
    if (param[2].field_0.field_3.Type != '\x01') {
      pcVar12 = "(param[paramnum]).Type == REGT_FLOAT";
LAB_003dbec8:
      __assert_fail(pcVar12,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x5b9,
                    "int AF_AActor_A_SpawnProjectile(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    pvVar16 = (void *)param[2].field_0.f;
    if (numparam == 3) {
      param = defaultparam->Array;
      goto LAB_003db868;
    }
    if (param[3].field_0.field_3.Type != '\x01') {
      pcVar12 = "(param[paramnum]).Type == REGT_FLOAT";
      goto LAB_003dbf06;
    }
    local_b8 = (void *)param[3].field_0.f;
    if ((uint)numparam < 5) {
      param = defaultparam->Array;
      goto LAB_003db879;
    }
    if (param[4].field_0.field_3.Type != '\x01') {
      pcVar12 = "(param[paramnum]).Type == REGT_FLOAT";
      goto LAB_003dbe97;
    }
    local_d0 = param[4].field_0.f;
    uVar14 = SUB84(local_d0,0);
    uVar15 = (undefined4)((ulong)local_d0 >> 0x20);
    if (numparam == 5) {
      param = defaultparam->Array;
      goto LAB_003db88a;
    }
    if (param[5].field_0.field_3.Type != '\0') {
      pcVar12 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_003dbe78;
    }
    uVar11 = param[5].field_0.i;
    if ((uint)numparam < 7) {
      param = defaultparam->Array;
      goto LAB_003db899;
    }
    if (param[6].field_0.field_3.Type != '\x01') {
      pcVar12 = "(param[paramnum]).Type == REGT_FLOAT";
      goto LAB_003dbe59;
    }
    local_d8 = param[6].field_0.f;
    if (numparam == 7) {
      param = defaultparam->Array;
      goto LAB_003db8b0;
    }
    if (param[7].field_0.field_3.Type != '\0') {
      pcVar12 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_003dbe3a;
    }
  }
  pAVar7 = COPY_AAPTR(origin,param[7].field_0.i);
  uVar13 = uVar11 & 3;
  if ((pAVar7 == (AActor *)0x0) && (uVar13 != 2)) {
    if ((uVar11 & 8) == 0) {
      return 0;
    }
    if (origin->SeeState == (FState *)0x0) {
      return 0;
    }
    if ((origin->health < 1) && (((origin->flags3).Value & 0x2000) != 0)) {
      return 0;
    }
    AActor::SetState(origin,origin->SeeState,false);
    return 0;
  }
  if (bVar5) {
    return 0;
  }
  dVar18 = (origin->Angles).Yaw.Degrees + -90.0;
  dVar17 = fastcosdeg(dVar18);
  dVar18 = fastsindeg(dVar18);
  local_a0 = 0.0;
  dVar2 = AActor::GetBobOffset(origin,0.0);
  if (origin->player != (player_t *)0x0) {
    local_a0 = origin->player->crouchoffset;
  }
  dVar17 = dVar17 * (double)local_b8;
  dVar18 = dVar18 * (double)local_b8;
  if (uVar13 == 1) {
    dVar2 = AActor::GetBobOffset(origin,0.0);
    AActor::Vec3Offset(&local_48,origin,dVar17,dVar18,(double)pvVar16 + dVar2,false);
    pAVar7 = P_SpawnMissileXYZ(&local_48,origin,pAVar7,type,false,(AActor *)0x0);
  }
  else {
    dVar3 = (origin->__Pos).X;
    dVar4 = (origin->__Pos).Y;
    dVar1 = (origin->__Pos).Z;
    if (uVar13 == 2) {
      AActor::Vec3Offset((DVector3 *)(local_98 + 0x10),origin,dVar17,dVar18,0.0,false);
      (origin->__Pos).Z = local_78;
      (origin->__Pos).X = (double)local_98._16_8_;
      (origin->__Pos).Y = dStack_80;
      dVar18 = AActor::GetBobOffset(origin,0.0);
      local_98._8_8_ = (origin->Angles).Yaw.Degrees;
      pAVar7 = P_SpawnMissileAngleZSpeed
                         (origin,dVar18 + local_78 + (double)pvVar16,type,(DAngle *)(local_98 + 8),
                          0.0,*(double *)((type->super_PClass).Defaults + 0xe0),origin,false);
      (origin->__Pos).Z = dVar1;
      (origin->__Pos).X = dVar3;
      (origin->__Pos).Y = dVar4;
      uVar11 = uVar11 | 0x10;
    }
    else {
      AActor::Vec3Offset((DVector3 *)(local_98 + 0x10),origin,dVar17,dVar18,
                         (double)pvVar16 + dVar2 + -32.0 + local_a0,false);
      (origin->__Pos).Z = local_78;
      local_68.Z = local_78 + 32.0;
      (origin->__Pos).X = (double)local_98._16_8_;
      (origin->__Pos).Y = dStack_80;
      local_68.X = (double)local_98._16_8_;
      local_68.Y = dStack_80;
      pAVar7 = P_SpawnMissileXYZ(&local_68,origin,pAVar7,type,false,(AActor *)0x0);
      (origin->__Pos).Z = dVar1;
      (origin->__Pos).X = dVar3;
      (origin->__Pos).Y = dVar4;
    }
  }
  if (pAVar7 == (AActor *)0x0) {
    return 0;
  }
  if ((uVar11 & 0x30) == 0) {
    dVar18 = AActor::VelXYToSpeed(pAVar7);
  }
  else {
    if ((uVar11 & 0x20) != 0) {
      TVector3<double>::Pitch((TVector3<double> *)local_98);
      local_d8 = local_d8 + (double)local_98._0_8_;
    }
    dVar18 = fastcosdeg(local_d8);
    dVar18 = ABS(dVar18 * pAVar7->Speed);
    dVar17 = fastsindeg(local_d8);
    dVar17 = dVar17 * pAVar7->Speed;
    (pAVar7->Vel).Z = dVar17;
    if ((uVar11 >> 8 & 1) == 0) {
      (pAVar7->Vel).Z = -dVar17;
    }
  }
  if ((uVar11 & 0x40) != 0) {
    (pAVar7->Angles).Pitch.Degrees = local_d8;
  }
  if (-1 < (char)uVar11) {
    local_d0 = local_d0 + (pAVar7->Angles).Yaw.Degrees;
  }
  (pAVar7->Angles).Yaw.Degrees = local_d0;
  AActor::VelFromAngle(pAVar7,dVar18);
  precise = SUB41((uVar11 & 4) >> 2,0);
  bVar5 = AActor::isMissile(origin,precise);
  pAVar9 = origin;
  if (bVar5) {
    while (bVar5 = AActor::isMissile(pAVar9,precise), bVar5) {
      pAVar8 = GC::ReadBarrier<AActor>((AActor **)&pAVar9->target);
      if (pAVar8 == (AActor *)0x0) break;
      pAVar9 = GC::ReadBarrier<AActor>((AActor **)&pAVar9->target);
    }
    (pAVar7->target).field_0.p = pAVar9;
    lVar10 = 0x278;
    if ((((pAVar7->flags2).Value & (origin->flags2).Value) >> 0x1e & 1) != 0) {
LAB_003dbd42:
      (pAVar7->tracer).field_0 =
           *(anon_union_8_2_947301c2_for_TObjPtr<AActor>_1 *)
            ((long)&(origin->super_DThinker).super_DObject._vptr_DObject + lVar10);
    }
  }
  else {
    lVar10 = 0x208;
    if (((pAVar7->flags2).Value & 0x40000000) != 0) goto LAB_003dbd42;
  }
  if (((pAVar7->flags4).Value & 0x40000) == 0) goto LAB_003dbd9d;
  pAVar9 = GC::ReadBarrier<AActor>((AActor **)&pAVar7->target);
  if (pAVar9 == (AActor *)0x0) {
LAB_003dbd94:
    BVar6 = '\0';
  }
  else {
    pAVar9 = GC::ReadBarrier<AActor>((AActor **)&pAVar7->target);
    if (pAVar9->player == (player_t *)0x0) goto LAB_003dbd94;
    BVar6 = (char)((long)&pAVar9->player[-0x916e].morphTics / 0x2a0) + '\x01';
  }
  pAVar7->FriendPlayer = BVar6;
LAB_003dbd9d:
  P_CheckMissileSpawn(pAVar7,origin->radius);
  return 0;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_SpawnProjectile)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_CLASS		(ti, AActor);
	PARAM_FLOAT_DEF	(Spawnheight);
	PARAM_FLOAT_DEF	(Spawnofs_xy);
	PARAM_ANGLE_DEF	(Angle);
	PARAM_INT_DEF	(flags);
	PARAM_ANGLE_DEF	(Pitch);
	PARAM_INT_DEF	(ptr);

	AActor *ref = COPY_AAPTR(self, ptr);

	int aimmode = flags & CMF_AIMMODE;

	AActor * targ;
	AActor * missile;

	if (ref != NULL || aimmode == 2)
	{
		if (ti) 
		{
			DAngle angle = self->Angles.Yaw - 90;
			double x = Spawnofs_xy * angle.Cos();
			double y = Spawnofs_xy * angle.Sin();
			double z = Spawnheight + self->GetBobOffset() - 32 + (self->player? self->player->crouchoffset : 0.);

			DVector3 pos = self->Pos();
			switch (aimmode)
			{
			case 0:
			default:
				// same adjustment as above (in all 3 directions this time) - for better aiming!
				self->SetXYZ(self->Vec3Offset(x, y, z));
				missile = P_SpawnMissileXYZ(self->PosPlusZ(32.), self, ref, ti, false);
				self->SetXYZ(pos);
				break;

			case 1:
				missile = P_SpawnMissileXYZ(self->Vec3Offset(x, y, self->GetBobOffset() + Spawnheight), self, ref, ti, false);
				break;

			case 2:
				self->SetXYZ(self->Vec3Offset(x, y, 0.));
				missile = P_SpawnMissileAngleZSpeed(self, self->Z() + self->GetBobOffset() + Spawnheight, ti, self->Angles.Yaw, 0, GetDefaultByType(ti)->Speed, self, false);
				self->SetXYZ(pos);

				flags |= CMF_ABSOLUTEPITCH;

				break;
			}

			if (missile != NULL)
			{
				// Use the actual velocity instead of the missile's Speed property
				// so that this can handle missiles with a high vertical velocity 
				// component properly.

				double missilespeed;

				if ( (CMF_ABSOLUTEPITCH|CMF_OFFSETPITCH) & flags)
				{
					if (CMF_OFFSETPITCH & flags)
					{
						Pitch += missile->Vel.Pitch();
					}
					missilespeed = fabs(Pitch.Cos() * missile->Speed);
					missile->Vel.Z = Pitch.Sin() * missile->Speed;
					if (!(flags & CMF_BADPITCH)) missile->Vel.Z *= -1;
				}
				else
				{
					missilespeed = missile->VelXYToSpeed();
				}

				if (CMF_SAVEPITCH & flags)
				{
					missile->Angles.Pitch = Pitch;
					// In aimmode 0 and 1 without absolutepitch or offsetpitch, the pitch parameter
					// contains the unapplied parameter. In that case, it is set as pitch without
					// otherwise affecting the spawned actor.
				}

				missile->Angles.Yaw = (CMF_ABSOLUTEANGLE & flags) ? Angle : missile->Angles.Yaw + Angle;
				missile->VelFromAngle(missilespeed);
	
				// handle projectile shooting projectiles - track the
				// links back to a real owner
                if (self->isMissile(!!(flags & CMF_TRACKOWNER)))
                {
                	AActor *owner = self ;//->target;
                	while (owner->isMissile(!!(flags & CMF_TRACKOWNER)) && owner->target)
						owner = owner->target;
                	targ = owner;
                	missile->target = owner;
					// automatic handling of seeker missiles
					if (self->flags2 & missile->flags2 & MF2_SEEKERMISSILE)
					{
						missile->tracer = self->tracer;
					}
                }
				else if (missile->flags2 & MF2_SEEKERMISSILE)
				{
					// automatic handling of seeker missiles
					missile->tracer = self->target;
				}
				// we must redo the spectral check here because the owner is set after spawning so the FriendPlayer value may be wrong
				if (missile->flags4 & MF4_SPECTRAL)
				{
					if (missile->target != NULL)
					{
						missile->SetFriendPlayer(missile->target->player);
					}
					else
					{
						missile->FriendPlayer = 0;
					}
				}
				P_CheckMissileSpawn(missile, self->radius);
			}
		}
	}
	else if (flags & CMF_CHECKTARGETDEAD)
	{
		// Target is dead and the attack shall be aborted.
		if (self->SeeState != NULL && (self->health > 0 || !(self->flags3 & MF3_ISMONSTER)))
			self->SetState(self->SeeState);
	}
	return 0;
}